

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::ProcessMorphAnimDatas
          (FBXConverter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
          *morphAnimDatas,BlendShapeChannel *bsc,AnimationCurveNode *node)

{
  long lVar1;
  iterator __position;
  iterator __position_00;
  byte bVar2;
  _Alloc_hider _Var3;
  int iVar4;
  Object *pOVar5;
  long lVar6;
  __normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
  _Var7;
  __normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
  _Var8;
  iterator iVar9;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *this_00;
  AnimationCurveMap *pAVar10;
  _Rb_tree_header *p_Var11;
  _Base_ptr p_Var12;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *p_Var13;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_01;
  undefined8 uVar14;
  ulong uVar15;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *p_Var16;
  uint uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  char *pcVar19;
  pointer ppCVar20;
  long *plVar21;
  size_t sVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  float fVar26;
  uint channelIndex;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>
  curvesIt;
  Geometry *geo;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  geoConnections;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  bsConnections;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  bscConnections;
  aiString name;
  uint local_54c;
  string local_548;
  string local_528;
  long local_508;
  FBXConverter *local_500;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
  *local_4f8;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *local_4f0;
  pointer local_4e8;
  pointer local_4e0;
  pointer local_4d8;
  pointer local_4d0;
  _Base_ptr local_4c8;
  AnimationCurveNode *local_4c0;
  pointer local_4b8;
  pointer local_4b0;
  _Base_ptr local_4a8;
  _Base_ptr local_4a0;
  long *local_498;
  long local_490;
  BlendShapeChannel *local_488;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_480;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_468;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_450;
  uint local_434;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430 [64];
  
  local_500 = this;
  local_4c0 = node;
  local_488 = bsc;
  Document::GetConnectionsBySourceSequenced
            (&local_450,this->doc,(bsc->super_Deformer).super_Object.id,"Deformer");
  local_4e8 = local_450.
              super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_450.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_450.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_4c8 = &(morphAnimDatas->_M_t)._M_impl.super__Rb_tree_header._M_header;
    ppCVar20 = local_450.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_4f8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
                 *)morphAnimDatas;
    do {
      local_4e0 = ppCVar20;
      pOVar5 = Connection::DestinationObject(*ppCVar20);
      if (((pOVar5 != (Object *)0x0) &&
          (lVar6 = __dynamic_cast(pOVar5,&Object::typeinfo,&BlendShape::typeinfo,0), lVar6 != 0)) &&
         (_Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<Assimp::FBX::BlendShapeChannel_const*const*,std::vector<Assimp::FBX::BlendShapeChannel_const*,std::allocator<Assimp::FBX::BlendShapeChannel_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::FBX::BlendShapeChannel_const*const>>
                            (*(undefined8 *)(lVar6 + 0x48),*(undefined8 *)(lVar6 + 0x50),&local_488)
         , _Var7._M_current != *(BlendShapeChannel ***)(lVar6 + 0x50))) {
        local_54c = (uint)((ulong)((long)_Var7._M_current - *(long *)(lVar6 + 0x48)) >> 3);
        Document::GetConnectionsBySourceSequenced
                  (&local_468,local_500->doc,*(uint64_t *)(lVar6 + 0x30),"Geometry");
        local_4d8 = local_468.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        ppCVar20 = local_468.
                   super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (local_468.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_468.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_4d0 = ppCVar20;
            pOVar5 = Connection::DestinationObject(*ppCVar20);
            if ((pOVar5 != (Object *)0x0) &&
               (local_490 = __dynamic_cast(pOVar5,&Object::typeinfo,&Geometry::typeinfo,0),
               local_490 != 0)) {
              Document::GetConnectionsBySourceSequenced
                        (&local_480,local_500->doc,*(uint64_t *)(local_490 + 0x30),"Model");
              local_4b8 = local_480.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              ppCVar20 = local_480.
                         super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              if (local_480.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_480.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                do {
                  paVar18 = &local_528.field_2;
                  pOVar5 = Connection::DestinationObject(*ppCVar20);
                  local_4b0 = ppCVar20;
                  if ((pOVar5 != (Object *)0x0) &&
                     (lVar6 = __dynamic_cast(pOVar5,&Object::typeinfo,&Model::typeinfo,0),
                     lVar6 != 0)) {
                    _Var8 = std::
                            __find_if<__gnu_cxx::__normal_iterator<Assimp::FBX::Geometry_const*const*,std::vector<Assimp::FBX::Geometry_const*,std::allocator<Assimp::FBX::Geometry_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::FBX::Geometry_const*const>>
                                      (*(undefined8 *)(lVar6 + 0x50),*(undefined8 *)(lVar6 + 0x58),
                                       &local_490);
                    lVar1 = *(long *)(lVar6 + 0x50);
                    local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_548,*(long *)(lVar6 + 0x10),
                               *(long *)(lVar6 + 0x18) + *(long *)(lVar6 + 0x10));
                    pcVar19 = "*";
                    std::__cxx11::string::append((char *)&local_548);
                    FixNodeName(&local_528,(FBXConverter *)pcVar19,&local_548);
                    _Var3._M_p = local_528._M_dataplus._M_p;
                    sVar22 = local_528._M_string_length & 0xffffffff;
                    if ((local_528._M_string_length & 0xfffffc00) != 0) {
                      sVar22 = 0x3ff;
                    }
                    local_434 = (uint)sVar22;
                    memcpy(local_430,local_528._M_dataplus._M_p,sVar22);
                    local_430[0]._M_local_buf[sVar22] = '\0';
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var3._M_p != paVar18) {
                      operator_delete(_Var3._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_548._M_dataplus._M_p != &local_548.field_2) {
                      operator_delete(local_548._M_dataplus._M_p);
                    }
                    uVar23 = (ulong)((long)_Var8._M_current - lVar1) >> 3;
                    uVar15 = (ulong)local_434;
                    pcVar19 = local_430[0]._M_local_buf + uVar15;
                    local_434 = 1;
                    if ((int)uVar23 < 0) {
                      *pcVar19 = '-';
                      pcVar19 = local_430[0]._M_local_buf + uVar15 + 1;
                      uVar23 = (ulong)(uint)-(int)uVar23;
                      local_434 = 2;
                    }
                    iVar4 = 1000000000;
                    bVar2 = 0;
                    do {
                      uVar15 = (ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff;
                      lVar6 = (long)uVar15 / (long)iVar4;
                      bVar24 = (int)lVar6 != 0;
                      bVar25 = iVar4 == 1;
                      if ((bool)(bVar2 | bVar25 | bVar24)) {
                        *pcVar19 = (char)lVar6 + '0';
                        pcVar19 = pcVar19 + 1;
                        local_434 = local_434 + 1;
                        uVar23 = (long)uVar15 % (long)iVar4 & 0xffffffff;
                        if (iVar4 == 1) break;
                      }
                      iVar4 = iVar4 / 10;
                      bVar2 = bVar2 | bVar25 | bVar24;
                    } while (local_434 < 0x3ff);
                    *pcVar19 = '\0';
                    local_528._M_dataplus._M_p = (pointer)paVar18;
                    sVar22 = strlen(local_430[0]._M_local_buf);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_528,local_430,local_430[0]._M_local_buf + sVar22);
                    iVar9 = std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                                    *)local_4f8,&local_528);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_528._M_dataplus._M_p != paVar18) {
                      operator_delete(local_528._M_dataplus._M_p);
                    }
                    if (iVar9._M_node == local_4c8) {
                      this_00 = (_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                 *)operator_new(0x30);
                      *(undefined8 *)(this_00 + 0x10) = 0;
                      *(undefined8 *)(this_00 + 0x18) = 0;
                      *(undefined8 *)this_00 = 0;
                      *(undefined8 *)(this_00 + 8) = 0;
                      *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                        **)(this_00 + 0x18) = this_00 + 8;
                      *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                        **)(this_00 + 0x20) = this_00 + 8;
                      *(undefined8 *)(this_00 + 0x28) = 0;
                      local_528._M_dataplus._M_p = (pointer)local_430;
                      local_528._M_string_length = (size_type)this_00;
                      std::
                      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
                      ::
                      _M_emplace_unique<std::pair<char_const*,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>
                                (local_4f8,
                                 (pair<const_char_*,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>
                                  *)&local_528);
                    }
                    else {
                      this_00 = *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                  **)(iVar9._M_node + 2);
                    }
                    pAVar10 = AnimationCurveNode::Curves_abi_cxx11_(local_4c0);
                    p_Var12 = (pAVar10->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    p_Var11 = &(pAVar10->_M_t)._M_impl.super__Rb_tree_header;
                    if ((_Rb_tree_header *)p_Var12 != p_Var11) {
                      local_4f0 = this_00 + 8;
                      local_4a8 = &p_Var11->_M_header;
                      do {
                        local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_528,*(long *)(p_Var12 + 1),
                                   (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1))
                        ;
                        local_508 = *(long *)(p_Var12 + 2);
                        local_4a0 = p_Var12;
                        iVar4 = std::__cxx11::string::compare((char *)&local_528);
                        lVar6 = local_508;
                        if (iVar4 == 0) {
                          plVar21 = *(long **)(local_508 + 0x38);
                          local_498 = *(long **)(local_508 + 0x40);
                          if (plVar21 != local_498) {
                            uVar17 = 0;
                            do {
                              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*plVar21;
                              p_Var16 = *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                          **)(this_00 + 0x10);
                              p_Var13 = local_4f0;
                              if (p_Var16 ==
                                  (_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                   *)0x0) {
LAB_001787c8:
                                this_01 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                                          operator_new(0x30);
                                *(undefined8 *)(this_01 + 0x20) = 0;
                                *(undefined8 *)(this_01 + 0x28) = 0;
                                *(undefined8 *)(this_01 + 0x10) = 0;
                                *(undefined8 *)(this_01 + 0x18) = 0;
                                *(undefined8 *)&this_01->field_0x0 = 0;
                                *(undefined8 *)(this_01 + 8) = 0;
                                local_548._M_dataplus._M_p = (pointer)paVar18;
                                local_548._M_string_length = (size_type)this_01;
                                std::
                                _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                ::_M_emplace_unique<std::pair<long,morphKeyData*>>
                                          (this_00,(pair<long,_morphKeyData_*> *)&local_548);
                              }
                              else {
                                do {
                                  if ((long)paVar18 <= *(long *)(p_Var16 + 0x20)) {
                                    p_Var13 = p_Var16;
                                  }
                                  p_Var16 = *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                              **)(p_Var16 +
                                                 (ulong)(*(long *)(p_Var16 + 0x20) < (long)paVar18)
                                                 * 8 + 0x10);
                                } while (p_Var16 !=
                                         (_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                          *)0x0);
                                if ((p_Var13 == local_4f0) ||
                                   ((long)paVar18 < *(long *)(p_Var13 + 0x20))) goto LAB_001787c8;
                                this_01 = *(vector<unsigned_int,std::allocator<unsigned_int>> **)
                                           (p_Var13 + 0x28);
                              }
                              __position._M_current = *(uint **)(this_01 + 8);
                              if (__position._M_current == *(uint **)(this_01 + 0x10)) {
                                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                                _M_realloc_insert<unsigned_int_const&>
                                          (this_01,__position,&local_54c);
                              }
                              else {
                                *__position._M_current = local_54c;
                                *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 4;
                              }
                              lVar1 = *(long *)(lVar6 + 0x50);
                              if ((ulong)(*(long *)(lVar6 + 0x58) - lVar1 >> 2) <= (ulong)uVar17) {
                                uVar14 = std::__throw_out_of_range_fmt
                                                   (
                                                  "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                                  );
                                if (local_450.
                                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_450.
                                                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                _Unwind_Resume(uVar14);
                              }
                              fVar26 = *(float *)(lVar1 + (ulong)uVar17 * 4) / 100.0;
                              local_548._M_dataplus._M_p._0_4_ = fVar26;
                              __position_00._M_current = *(float **)(this_01 + 0x20);
                              if (__position_00._M_current == *(float **)(this_01 + 0x28)) {
                                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                                          ((vector<float,_std::allocator<float>_> *)(this_01 + 0x18)
                                           ,__position_00,(float *)&local_548);
                              }
                              else {
                                *__position_00._M_current = fVar26;
                                *(long *)(this_01 + 0x20) = *(long *)(this_01 + 0x20) + 4;
                              }
                              uVar17 = uVar17 + 1;
                              plVar21 = plVar21 + 1;
                            } while (plVar21 != local_498);
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_528._M_dataplus._M_p != &local_528.field_2) {
                          operator_delete(local_528._M_dataplus._M_p);
                        }
                        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(local_4a0);
                      } while (p_Var12 != local_4a8);
                    }
                  }
                  ppCVar20 = local_4b0 + 1;
                } while (ppCVar20 != local_4b8);
              }
              if (local_480.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_480.
                                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            ppCVar20 = local_4d0 + 1;
          } while (ppCVar20 != local_4d8);
        }
        if (local_468.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_468.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      ppCVar20 = local_4e0 + 1;
    } while (ppCVar20 != local_4e8);
  }
  if (local_450.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_450.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FBXConverter::ProcessMorphAnimDatas(std::map<std::string, morphAnimData*>* morphAnimDatas, const BlendShapeChannel* bsc, const AnimationCurveNode* node) {
            std::vector<const Connection*> bscConnections = doc.GetConnectionsBySourceSequenced(bsc->ID(), "Deformer");
            for (const Connection* bscConnection : bscConnections) {
                auto bs = dynamic_cast<const BlendShape*>(bscConnection->DestinationObject());
                if (bs) {
                    auto channelIt = std::find(bs->BlendShapeChannels().begin(), bs->BlendShapeChannels().end(), bsc);
                    if (channelIt != bs->BlendShapeChannels().end()) {
                        auto channelIndex = static_cast<unsigned int>(std::distance(bs->BlendShapeChannels().begin(), channelIt));
                        std::vector<const Connection*> bsConnections = doc.GetConnectionsBySourceSequenced(bs->ID(), "Geometry");
                        for (const Connection* bsConnection : bsConnections) {
                            auto geo = dynamic_cast<const Geometry*>(bsConnection->DestinationObject());
                            if (geo) {
                                std::vector<const Connection*> geoConnections = doc.GetConnectionsBySourceSequenced(geo->ID(), "Model");
                                for (const Connection* geoConnection : geoConnections) {
                                    auto model = dynamic_cast<const Model*>(geoConnection->DestinationObject());
                                    if (model) {
                                        auto geoIt = std::find(model->GetGeometry().begin(), model->GetGeometry().end(), geo);
                                        auto geoIndex = static_cast<unsigned int>(std::distance(model->GetGeometry().begin(), geoIt));
                                        auto name = aiString(FixNodeName(model->Name() + "*"));
                                        name.length = 1 + ASSIMP_itoa10(name.data + name.length, MAXLEN - 1, geoIndex);
                                        morphAnimData* animData;
                                        auto animIt = morphAnimDatas->find(name.C_Str());
                                        if (animIt == morphAnimDatas->end()) {
                                            animData = new morphAnimData();
                                            morphAnimDatas->insert(std::make_pair(name.C_Str(), animData));
                                        }
                                        else {
                                            animData = animIt->second;
                                        }
                                        for (std::pair<std::string, const AnimationCurve*> curvesIt : node->Curves()) {
                                            if (curvesIt.first == "d|DeformPercent") {
                                                const AnimationCurve* animationCurve = curvesIt.second;
                                                const KeyTimeList& keys = animationCurve->GetKeys();
                                                const KeyValueList& values = animationCurve->GetValues();
                                                unsigned int k = 0;
                                                for (auto key : keys) {
                                                    morphKeyData* keyData;
                                                    auto keyIt = animData->find(key);
                                                    if (keyIt == animData->end()) {
                                                        keyData = new morphKeyData();
                                                        animData->insert(std::make_pair(key, keyData));
                                                    }
                                                    else {
                                                        keyData = keyIt->second;
                                                    }
                                                    keyData->values.push_back(channelIndex);
                                                    keyData->weights.push_back(values.at(k) / 100.0f);
                                                    k++;
                                                }
                                            }
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }